

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ConfigCellIdentifierSyntax * __thiscall
slang::parsing::Parser::parseConfigCellIdentifier(Parser *this)

{
  Token cell;
  bool bVar1;
  ConfigCellIdentifierSyntax *pCVar2;
  Token TVar3;
  Token TVar4;
  Token TVar5;
  undefined8 local_70;
  Info *pIStack_68;
  undefined8 local_60;
  Info *pIStack_58;
  Token local_50;
  Token local_40;
  
  TVar3 = ParserBase::expect(&this->super_ParserBase,Identifier);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Dot);
  if (bVar1) {
    TVar4 = ParserBase::consume(&this->super_ParserBase);
    TVar5 = ParserBase::expect(&this->super_ParserBase,Identifier);
    local_60 = TVar5._0_8_;
    pIStack_58 = TVar5.info;
    local_40 = TVar3;
    local_50 = TVar4;
  }
  else {
    Token::Token(&local_40);
    Token::Token(&local_50);
    local_70 = TVar3._0_8_;
    pIStack_68 = TVar3.info;
    local_60 = local_70;
    pIStack_58 = pIStack_68;
  }
  cell.info = pIStack_58;
  cell.kind = (short)local_60;
  cell._2_1_ = (char)((ulong)local_60 >> 0x10);
  cell.numFlags.raw = (char)((ulong)local_60 >> 0x18);
  cell.rawLen = (int)((ulong)local_60 >> 0x20);
  pCVar2 = slang::syntax::SyntaxFactory::configCellIdentifier(&this->factory,local_40,local_50,cell)
  ;
  return pCVar2;
}

Assistant:

ConfigCellIdentifierSyntax& Parser::parseConfigCellIdentifier() {
    auto id1 = expect(TokenKind::Identifier);
    if (peek(TokenKind::Dot)) {
        auto dot = consume();
        return factory.configCellIdentifier(id1, dot, expect(TokenKind::Identifier));
    }

    return factory.configCellIdentifier(Token(), Token(), id1);
}